

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.cpp
# Opt level: O1

shared_ptr<duckdb::BlockHandle,_true> __thiscall
duckdb::BlockManager::ConvertToPersistent
          (BlockManager *this,block_id_t block_id,shared_ptr<duckdb::BlockHandle,_true> *old_block,
          BufferHandle *old_handle)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  BlockHandle *pBVar2;
  type pFVar3;
  type l;
  type pBVar4;
  BufferPool *pBVar5;
  EvictionQueue *this_01;
  InternalException *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer *__ptr;
  BufferHandle *in_R8;
  shared_ptr<duckdb::BlockHandle,_true> sVar6;
  unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>,_true> converted_buffer;
  BlockLock lock;
  string local_68;
  unique_lock<std::mutex> local_48;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> local_38;
  
  RegisterBlock(this,block_id);
  pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&old_handle->handle);
  local_48._M_device = &pBVar2->lock;
  local_48._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_48);
  local_48._M_owns = true;
  pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&old_handle->handle);
  if ((pBVar2->readers).super___atomic_base<int>._M_i < 2) {
    pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&old_handle->handle);
    pFVar3 = unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>::
             operator*(&pBVar2->buffer);
    (**(code **)(*(long *)block_id + 0x10))(&local_68,block_id,old_block,pFVar3);
    l = unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>,_true>::operator*
                  ((unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>,_true> *)&local_68)
    ;
    (**(code **)(*(long *)block_id + 0x70))(block_id,l,old_block);
    pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&old_handle->handle);
    pBVar4 = shared_ptr<duckdb::BlockHandle,_true>::operator*
                       ((shared_ptr<duckdb::BlockHandle,_true> *)this);
    local_38._M_head_impl = (FileBuffer *)local_68._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)0x0;
    BlockHandle::ConvertToPersistent
              (pBVar2,(BlockLock *)l,pBVar4,
               (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
               &local_38);
    if (local_38._M_head_impl != (FileBuffer *)0x0) {
      (*(local_38._M_head_impl)->_vptr_FileBuffer[1])();
    }
    local_38._M_head_impl = (FileBuffer *)0x0;
    ::std::unique_lock<std::mutex>::unlock(&local_48);
    BufferHandle::Destroy(in_R8);
    this_00 = (old_handle->handle).internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (old_handle->handle).internal.
    super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    (old_handle->handle).internal.
    super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    pBVar5 = (BufferPool *)(**(code **)(**(long **)(block_id + 8) + 0xf8))();
    bVar1 = BufferPool::AddToEvictionQueue(pBVar5,(shared_ptr<duckdb::BlockHandle,_true> *)this);
    if (bVar1) {
      pBVar5 = (BufferPool *)(**(code **)(**(long **)(block_id + 8) + 0xf8))();
      pBVar4 = shared_ptr<duckdb::BlockHandle,_true>::operator*
                         ((shared_ptr<duckdb::BlockHandle,_true> *)this);
      this_01 = BufferPool::GetEvictionQueueForBlockHandle(pBVar5,pBVar4);
      EvictionQueue::Purge(this_01);
    }
    if ((long *)local_68._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_68._M_dataplus._M_p + 8))();
    }
    ::std::unique_lock<std::mutex>::~unique_lock(&local_48);
    sVar6.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar6.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<duckdb::BlockHandle,_true>)
           sVar6.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "BlockManager::ConvertToPersistent - cannot be called for block %d as old_block has multiple readers active"
             ,"");
  InternalException::InternalException<long>(this_02,&local_68,(long)old_block);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<BlockHandle> BlockManager::ConvertToPersistent(block_id_t block_id, shared_ptr<BlockHandle> old_block,
                                                          BufferHandle old_handle) {
	// register a block with the new block id
	auto new_block = RegisterBlock(block_id);
	D_ASSERT(new_block->GetState() == BlockState::BLOCK_UNLOADED);
	D_ASSERT(new_block->Readers() == 0);

	auto lock = old_block->GetLock();
	D_ASSERT(old_block->GetState() == BlockState::BLOCK_LOADED);
	D_ASSERT(old_block->GetBuffer(lock));
	if (old_block->Readers() > 1) {
		throw InternalException("BlockManager::ConvertToPersistent - cannot be called for block %d as old_block has "
		                        "multiple readers active",
		                        block_id);
	}

	// Temp buffers can be larger than the storage block size.
	// But persistent buffers cannot.
	D_ASSERT(old_block->GetBuffer(lock)->AllocSize() <= GetBlockAllocSize());

	// convert the buffer to a block
	auto converted_buffer = ConvertBlock(block_id, *old_block->GetBuffer(lock));

	// persist the new block to disk
	Write(*converted_buffer, block_id);

	// now convert the actual block
	old_block->ConvertToPersistent(lock, *new_block, std::move(converted_buffer));

	// destroy the old buffer
	lock.unlock();
	old_handle.Destroy();
	old_block.reset();

	// potentially purge the queue
	auto purge_queue = buffer_manager.GetBufferPool().AddToEvictionQueue(new_block);
	if (purge_queue) {
		buffer_manager.GetBufferPool().PurgeQueue(*new_block);
	}
	return new_block;
}